

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::(anonymous_namespace)::IsSubstringImpl<std::__cxx11::wstring>
          (bool expected_to_be_substring,char *needle_expr,char *haystack_expr,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *needle,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *haystack)

{
  bool bVar1;
  AssertionResult *this;
  AssertionResult *other;
  AssertionResult *this_00;
  AssertionResult *value;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  byte in_SIL;
  undefined8 in_RDI;
  AssertionResult AVar3;
  char *begin_string_quote;
  bool is_wide_string;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffef8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff00;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff28;
  AssertionResult *in_stack_ffffffffffffff30;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var2;
  
  bVar1 = IsSubstringPred<std::__cxx11::wstring>
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if (bVar1 == (bool)(in_SIL & 1)) {
    AVar3 = AssertionSuccess();
    _Var2._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )AVar3.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  }
  else {
    AssertionFailure();
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char (*) [11])in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char **)in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char (*) [2])in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char (*) [11])in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char **)in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char (*) [3])in_stack_ffffffffffffff28);
    this = AssertionResult::operator<<
                     (in_stack_ffffffffffffff30,(char (*) [11])in_stack_ffffffffffffff28);
    other = AssertionResult::operator<<
                      (in_stack_ffffffffffffff30,(char **)in_stack_ffffffffffffff28);
    this_00 = AssertionResult::operator<<
                        (in_stack_ffffffffffffff30,(char (*) [16])in_stack_ffffffffffffff28);
    value = AssertionResult::operator<<(this_00,(char **)in_stack_ffffffffffffff28);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,(char **)value);
    AssertionResult::operator<<
              (this_00,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::AssertionResult(this,other);
    AssertionResult::~AssertionResult((AssertionResult *)0x14350c);
    _Var2._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         extraout_RDX._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var2._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult IsSubstringImpl(bool expected_to_be_substring,
                                const char* needle_expr,
                                const char* haystack_expr,
                                const StringType& needle,
                                const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
         << "Value of: " << needle_expr << "\n"
         << "  Actual: " << begin_string_quote << needle << "\"\n"
         << "Expected: " << (expected_to_be_substring ? "" : "not ")
         << "a substring of " << haystack_expr << "\n"
         << "Which is: " << begin_string_quote << haystack << "\"";
}